

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_clearAllDicts(ZSTD_CCtx *cctx)

{
  ZSTD_customMem customMem;
  long in_RDI;
  void *unaff_retaddr;
  ZSTD_CDict *in_stack_00000008;
  undefined8 in_stack_fffffffffffffff0;
  
  customMem.customFree = (ZSTD_freeFunction)in_RDI;
  customMem.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffff0;
  customMem.opaque = unaff_retaddr;
  ZSTD_customFree(*(void **)(in_RDI + 0x358),customMem);
  ZSTD_freeCDict(in_stack_00000008);
  memset((void *)(in_RDI + 0xe30),0,0x28);
  memset((void *)(in_RDI + 0xe60),0,0x18);
  *(undefined8 *)(in_RDI + 0xe58) = 0;
  return;
}

Assistant:

static void ZSTD_clearAllDicts(ZSTD_CCtx* cctx)
{
    ZSTD_customFree(cctx->localDict.dictBuffer, cctx->customMem);
    ZSTD_freeCDict(cctx->localDict.cdict);
    ZSTD_memset(&cctx->localDict, 0, sizeof(cctx->localDict));
    ZSTD_memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));
    cctx->cdict = NULL;
}